

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O1

void __thiscall
cnn::Model::save<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_2)

{
  basic_oserializer *pbVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int nlp;
  int np;
  undefined8 local_28;
  
  local_28 = CONCAT44((int)((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 3),
                      (int)((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30)) >> 3));
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>
            (ar,(int *)((long)&local_28 + 4));
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>
            (ar,(int *)&local_28);
  lVar3 = *(long *)(this + 0x18);
  if (*(long *)(this + 0x20) != lVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      pbVar1 = *(basic_oserializer **)(lVar3 + uVar4 * 8);
      boost::serialization::
      singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Parameters>_>
      ::get_instance();
      boost::archive::detail::basic_oarchive::save_object(ar,pbVar1);
      lVar3 = *(long *)(this + 0x18);
      bVar2 = uVar5 < (ulong)(*(long *)(this + 0x20) - lVar3 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  lVar3 = *(long *)(this + 0x30);
  if (*(long *)(this + 0x38) != lVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      pbVar1 = *(basic_oserializer **)(lVar3 + uVar4 * 8);
      boost::serialization::
      singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::LookupParameters>_>
      ::get_instance();
      boost::archive::detail::basic_oarchive::save_object(ar,pbVar1);
      lVar3 = *(long *)(this + 0x30);
      bVar2 = uVar5 < (ulong)(*(long *)(this + 0x38) - lVar3 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    int np = params.size();
    int nlp = lookup_params.size();
    ar & np;
    ar & nlp;
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
  }